

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

int StopThreadSBGx(SBG *pSBG)

{
  CRITICAL_SECTION *__mutex;
  long lVar1;
  
  __mutex = SBGCS;
  lVar1 = 0;
  do {
    if (*(SBG **)((long)addrsSBG + lVar1 * 2) == pSBG) {
      *(undefined4 *)((long)bExitSBG + lVar1) = 1;
      WaitForThread(*(THREAD_IDENTIFIER *)((long)SBGThreadId + lVar1 * 2));
      pthread_mutex_destroy((pthread_mutex_t *)__mutex);
      *(undefined4 *)((long)resSBG + lVar1) = 1;
      return 0;
    }
    lVar1 = lVar1 + 4;
    __mutex = __mutex + 1;
  } while (lVar1 != 0x40);
  return 1;
}

Assistant:

HARDWAREX_API int StopThreadSBGx(SBG* pSBG)
{
	int id = 0;

	while (addrsSBG[id] != pSBG)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	bExitSBG[id] = TRUE;
	WaitForThread(SBGThreadId[id]);
	DeleteCriticalSection(&SBGCS[id]);
	resSBG[id] = EXIT_FAILURE;
	return EXIT_SUCCESS;
}